

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char> __thiscall
fmt::v7::detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
          (default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *this,handle handle)

{
  iterator iVar1;
  parse_context_type *in_RDI;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> format_ctx;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> parse_ctx;
  locale_ref loc;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> local_70;
  basic_string_view<char> local_48;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> local_38 [2];
  
  basic_string_view<char>::basic_string_view(&local_48);
  basic_format_parse_context<char,_fmt::v7::detail::error_handler>::basic_format_parse_context
            (local_38,local_48.data_,local_48.size_,0);
  loc.locale_ = in_RDI[1].format_str_.data_;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::basic_format_context
            (&local_70,(buffer_appender<char>)(in_RDI->format_str_).data_,
             *(basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               *)&(in_RDI->format_str_).size_,loc);
  basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  handle::format((handle *)loc.locale_,in_RDI,
                 (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)0x143ff1);
  iVar1 = basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out(&local_70);
  return (buffer_appender<char>)
         iVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt operator()(typename basic_format_arg<context>::handle handle) {
    basic_format_parse_context<Char> parse_ctx({});
    basic_format_context<OutputIt, Char> format_ctx(out, args, loc);
    handle.format(parse_ctx, format_ctx);
    return format_ctx.out();
  }